

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>_>
* __thiscall
Lib::
concatIters<Lib::VirtualIterator<Indexing::TermLiteralClause>,Lib::VirtualIterator<Indexing::TermLiteralClause>>
          (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>_>
           *__return_storage_ptr__,Lib *this,VirtualIterator<Indexing::TermLiteralClause> *i1,
          VirtualIterator<Indexing::TermLiteralClause> *i2)

{
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  *i;
  VirtualIterator<Indexing::TermLiteralClause> local_48;
  VirtualIterator<Indexing::TermLiteralClause> local_40;
  VirtualIterator<Indexing::TermLiteralClause> local_38;
  VirtualIterator<Indexing::TermLiteralClause> local_30;
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  local_28;
  
  local_48._core = *(IteratorCore<Indexing::TermLiteralClause> **)this;
  if (local_48._core != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
    (local_48._core)->_refCnt = (local_48._core)->_refCnt + 1;
  }
  local_40 = (VirtualIterator<Indexing::TermLiteralClause>)i1->_core;
  if (local_40._core != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
    (local_40._core)->_refCnt = (local_40._core)->_refCnt + 2;
  }
  local_30._core = local_40._core;
  iterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>>((Lib *)&local_38,&local_30);
  VirtualIterator<Indexing::TermLiteralClause>::~VirtualIterator(&local_30);
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  ::CatIterator(&local_28,&local_48,
                (IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_> *)&local_38);
  iterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>>>>
            (__return_storage_ptr__,(Lib *)&local_28,i);
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  ::~CatIterator(&local_28);
  VirtualIterator<Indexing::TermLiteralClause>::~VirtualIterator(&local_38);
  VirtualIterator<Indexing::TermLiteralClause>::~VirtualIterator(&local_40);
  VirtualIterator<Indexing::TermLiteralClause>::~VirtualIterator(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static auto concatIters(I1 i1, I2 i2, Is... is) 
{ return iterTraits(CatIterator<I1, decltype(concatIters(std::move(i2), std::move(is)...))>(std::move(i1), concatIters(std::move(i2), std::move(is)...))); }